

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class_visibility.c
# Opt level: O0

value class_visibility_value_pair(class_visibility_id visibility)

{
  value *str;
  value pvVar1;
  value *v_array;
  value v;
  value in_stack_00000050;
  size_t in_stack_ffffffffffffffd8;
  value *in_stack_ffffffffffffffe0;
  value local_8;
  
  local_8 = value_create_array(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (local_8 == (value)0x0) {
    local_8 = (value)0x0;
  }
  else {
    str = value_to_array((value)0x10934b);
    pvVar1 = value_create_string((char *)str,in_stack_ffffffffffffffd8);
    *str = pvVar1;
    if (*str == (value)0x0) {
      value_type_destroy(in_stack_00000050);
      local_8 = (value)0x0;
    }
    else {
      pvVar1 = class_visibility_value(VISIBILITY_PUBLIC);
      str[1] = pvVar1;
      if (str[1] == (value)0x0) {
        value_type_destroy(in_stack_00000050);
        local_8 = (value)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

value class_visibility_value_pair(enum class_visibility_id visibility)
{
	static const char visibility_str[] = "visibility";
	value v = value_create_array(NULL, 2);
	value *v_array;

	if (v == NULL)
	{
		return NULL;
	}

	v_array = value_to_array(v);
	v_array[0] = value_create_string(visibility_str, sizeof(visibility_str) - 1);

	if (v_array[0] == NULL)
	{
		value_type_destroy(v);
		return NULL;
	}

	v_array[1] = class_visibility_value(visibility);

	if (v_array[1] == NULL)
	{
		value_type_destroy(v);
		return NULL;
	}

	return v;
}